

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

char * deqp::gles31::Functional::anon_unknown_0::targetToName(deUint32 target)

{
  if (target == 0x8d41) {
    return "renderbuffer";
  }
  if (target == 0x806f) {
    return "texture3d";
  }
  if (target == 0x8513) {
    return "cubemap";
  }
  if (target != 0x8c1a) {
    if (target == 0xde1) {
      return "texture2d";
    }
    return (char *)0x0;
  }
  return "texture2d_array";
}

Assistant:

const char* targetToName (deUint32 target)
{
	switch (target)
	{
		case GL_RENDERBUFFER:		return "renderbuffer";
		case GL_TEXTURE_2D:			return "texture2d";
		case GL_TEXTURE_3D:			return "texture3d";
		case GL_TEXTURE_2D_ARRAY:	return "texture2d_array";
		case GL_TEXTURE_CUBE_MAP:	return "cubemap";

		default:
			DE_ASSERT(false);
			return NULL;
	}
}